

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O2

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxIkLink[]>(mmd *this,size_t n)

{
  PmxIkLink *pPVar1;
  ulong uVar2;
  PmxIkLink *this_00;
  
  uVar2 = n << 5;
  pPVar1 = (PmxIkLink *)operator_new__(-(ulong)(n >> 0x3b != 0) | uVar2);
  this_00 = pPVar1;
  if (n != 0) {
    do {
      pmx::PmxIkLink::PmxIkLink(this_00);
      uVar2 = uVar2 - 0x20;
      this_00 = this_00 + 1;
    } while (uVar2 != 0);
  }
  *(PmxIkLink **)this = pPVar1;
  return (__uniq_ptr_data<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxIkLink,_std::default_delete<pmx::PmxIkLink[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }